

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasMapFields(FileDescriptor *file)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = -1;
  lVar3 = 0;
  do {
    iVar1 = *(int *)(file + 0x2c);
    lVar4 = lVar4 + 1;
    if (iVar1 <= lVar4) break;
    bVar2 = HasMapFields((Descriptor *)(lVar3 + *(long *)(file + 0x58)));
    lVar3 = lVar3 + 0x88;
  } while (!bVar2);
  return lVar4 < iVar1;
}

Assistant:

bool HasMapFields(const FileDescriptor* file) {
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (HasMapFields(file->message_type(i))) return true;
  }
  return false;
}